

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::dht_put_alert,libtorrent::aux::stack_allocator&,std::array<char,32ul>const&,std::array<char,64ul>const&,std::__cxx11::string,long_const&,int&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,
          array<char,_32UL> *args_1,array<char,_64UL> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,long *args_4,
          int *args_5)

{
  size_t this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sig;
  array<char,_64UL> *key;
  array<char,_32UL> *paVar1;
  pointer pcVar2;
  size_t sVar3;
  string local_78;
  dht_put_alert *ret;
  header_t *hdr;
  size_t pad_bytes;
  char *ptr;
  long *args_local_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_3;
  array<char,_64UL> *args_local_2;
  array<char,_32UL> *args_local_1;
  stack_allocator *args_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  ptr = (char *)args_4;
  args_local_4 = (long *)args_3;
  args_local_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2;
  args_local_2 = (array<char,_64UL> *)args_1;
  args_local_1 = (array<char,_32UL> *)args;
  args_local = (stack_allocator *)this;
  if ((ulong)(long)this->m_capacity < (long)this->m_size + 0xd0U) {
    grow_capacity(this,0xd0);
  }
  pcVar2 = std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  pad_bytes = (size_t)(pcVar2 + this->m_size);
  hdr = (header_t *)libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x10),8);
  ret = (dht_put_alert *)pad_bytes;
  *(char *)(pad_bytes + 2) = (char)hdr;
  *(code **)(pad_bytes + 8) = move<libtorrent::dht_put_alert>;
  pad_bytes = (long)&hdr[1].len + pad_bytes;
  sVar3 = libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0xb8),8);
  paVar1 = args_local_1;
  key = args_local_2;
  sig = args_local_3;
  this_00 = pad_bytes;
  *(short *)&(ret->super_alert)._vptr_alert = (short)sVar3 + 0xb8;
  std::__cxx11::string::string((string *)&local_78,(string *)args_local_4);
  dht_put_alert::dht_put_alert
            ((dht_put_alert *)this_00,(stack_allocator *)paVar1,(array<char,_32UL> *)key,
             (array<char,_64UL> *)sig,&local_78,*(int64_t *)ptr,*args_5);
  std::__cxx11::string::~string((string *)&local_78);
  this->m_num_items = this->m_num_items + 1;
  this->m_size = (int)hdr + 0x10 + (uint)*(ushort *)&(ret->super_alert)._vptr_alert + this->m_size;
  return (type)this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U),  alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
			return *ret;
		}